

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfScanLineInputFile.cpp
# Opt level: O0

void __thiscall Imf_3_3::ScanLineInputFile::Data::Data(Data *this,Context *ctxt,int pN,int nT)

{
  undefined4 in_ECX;
  undefined4 in_EDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  Compression in_stack_0000001c;
  int in_stack_00000038;
  int in_stack_0000003c;
  Header *in_stack_00000040;
  Vec2<float> local_20 [4];
  
  *in_RDI = in_RSI;
  *(undefined4 *)(in_RDI + 1) = in_EDX;
  *(undefined4 *)((long)in_RDI + 0xc) = in_ECX;
  Imath_3_1::Vec2<float>::Vec2(local_20,0.0,0.0);
  Header::Header(in_stack_00000040,in_stack_0000003c,in_stack_00000038,this._4_4_,(V2f *)ctxt,
                 (float)pN,nT,in_stack_0000001c);
  *(undefined1 *)(in_RDI + 9) = 0;
  std::vector<char,_std::allocator<char>_>::vector((vector<char,_std::allocator<char>_> *)0x157f0b);
  FrameBuffer::FrameBuffer((FrameBuffer *)0x157f19);
  std::vector<Imf_3_3::Slice,_std::allocator<Imf_3_3::Slice>_>::vector
            ((vector<Imf_3_3::Slice,_std::allocator<Imf_3_3::Slice>_> *)0x157f2a);
  std::mutex::mutex((mutex *)0x157f3b);
  return;
}

Assistant:

Data (Context *ctxt, int pN, int nT)
    : _ctxt (ctxt)
    , partNumber (pN)
    , numThreads (nT)
    {}